

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_tokens_test.cc
# Opt level: O0

int main(void)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  istream *piVar4;
  char *pcVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  undefined1 local_370 [8];
  string computed_results;
  BracketNotationParser<label::StringLabel> bnp;
  string correct_result;
  string input_tree;
  string local_248 [8];
  string line;
  long local_218;
  ifstream test_cases_file;
  int local_c;
  
  local_c = 0;
  poVar3 = std::operator<<((ostream *)&std::cout,"Tokens test.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ifstream::ifstream(&local_218,"parser_tokens_test_data.txt",8);
  bVar1 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18)));
  if ((bVar1 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR: Problem reading the test file.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::string(local_248);
  do {
    do {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_218,local_248);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) {
        input_tree.field_2._12_4_ = 2;
        goto LAB_00102b7c;
      }
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_248);
    } while (*pcVar5 != '#');
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&local_218,local_248);
    std::__cxx11::string::string((string *)(correct_result.field_2._M_local_buf + 8),local_248);
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&local_218,local_248);
    std::__cxx11::string::string
              ((string *)(bnp.kMatchRightBracket.field_2._M_local_buf + 8),local_248);
    parser::BracketNotationParser<label::StringLabel>::BracketNotationParser
              ((BracketNotationParser<label::StringLabel> *)((long)&computed_results.field_2 + 8));
    bVar2 = parser::BracketNotationParser<label::StringLabel>::validate_input
                      ((BracketNotationParser<label::StringLabel> *)
                       ((long)&computed_results.field_2 + 8),
                       (string *)((long)&correct_result.field_2 + 8));
    if (bVar2) {
      parser::BracketNotationParser<label::StringLabel>::get_tokens
                (&local_388,
                 (BracketNotationParser<label::StringLabel> *)((long)&computed_results.field_2 + 8),
                 (string *)((long)&correct_result.field_2 + 8));
      vector_to_string((string *)local_370,&local_388);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_388);
      input_tree.field_2._M_local_buf[0xc] =
           std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&bnp.kMatchRightBracket.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_370);
      if ((bool)input_tree.field_2._M_local_buf[0xc]) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Incorrect tokens: ");
        poVar3 = std::operator<<(poVar3,(string *)local_370);
        poVar3 = std::operator<<(poVar3," instead of ");
        poVar3 = std::operator<<(poVar3,(string *)(bnp.kMatchRightBracket.field_2._M_local_buf + 8))
        ;
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 (string *)(correct_result.field_2._M_local_buf + 8));
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        local_c = -1;
      }
      input_tree.field_2._13_3_ = 0;
      std::__cxx11::string::~string((string *)local_370);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Incorrect format of input tree: \'");
      poVar3 = std::operator<<(poVar3,(string *)(correct_result.field_2._M_local_buf + 8));
      poVar3 = std::operator<<(poVar3,"\'. Is the number of opening and closing brackets equal?");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_c = -1;
      input_tree.field_2._12_4_ = 1;
    }
    parser::BracketNotationParser<label::StringLabel>::~BracketNotationParser
              ((BracketNotationParser<label::StringLabel> *)((long)&computed_results.field_2 + 8));
    std::__cxx11::string::~string((string *)(bnp.kMatchRightBracket.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(correct_result.field_2._M_local_buf + 8));
  } while (input_tree.field_2._12_4_ == 0);
LAB_00102b7c:
  std::__cxx11::string::~string(local_248);
  if (input_tree.field_2._12_4_ == 2) {
    local_c = 0;
  }
  std::ifstream::~ifstream(&local_218);
  return local_c;
}

Assistant:

int main() {

  using Label = label::StringLabel;
  
  std::cout << "Tokens test." << std::endl;

  // Parse test cases from file.
  std::ifstream test_cases_file("parser_tokens_test_data.txt");

  if (!test_cases_file) {
    std::cerr << "ERROR: Problem reading the test file." << std::endl;
  }

  for (std::string line; std::getline( test_cases_file, line);) {
    if (line[0] == '#') {
      std::getline(test_cases_file, line);
      std::string input_tree = line;
      std::getline(test_cases_file, line);
      std::string correct_result = line;

      parser::BracketNotationParser<Label> bnp;

      // Validate test tree.
      if (!bnp.validate_input(input_tree)) {
        std::cerr << "Incorrect format of input tree: '" << input_tree << "'. Is the number of opening and closing brackets equal?" << std::endl;
        return -1;
      }
      // Parse test tree.
      std::string computed_results = vector_to_string(bnp.get_tokens(input_tree));

      if (correct_result != computed_results) {
        std::cerr << "Incorrect tokens: " << computed_results << " instead of " << correct_result << std::endl;
        std::cerr << input_tree << std::endl;
        return -1;
      }
    }
  }

  return 0;
}